

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keylog.c
# Opt level: O3

_Bool Curl_tls_keylog_write(char *label,uchar *client_random,uchar *secret,size_t secretlen)

{
  byte bVar1;
  FILE *__stream;
  size_t __n;
  long lVar2;
  long lVar3;
  size_t sVar4;
  char line [195];
  char acStack_f8 [65];
  undefined1 auStack_b7 [135];
  
  __stream = keylog_file_fp;
  if ((keylog_file_fp != (FILE *)0x0) &&
     (__n = strlen(label), 0xffffffffffffffcf < secretlen - 0x31 && __n < 0x20)) {
    memcpy(acStack_f8,label,__n);
    acStack_f8[__n] = ' ';
    lVar3 = 0;
    do {
      bVar1 = *client_random;
      acStack_f8[lVar3 + __n + 1] = "0123456789ABCDEF"[bVar1 >> 4];
      acStack_f8[lVar3 + __n + 2] = "0123456789ABCDEF"[bVar1 & 0xf];
      lVar3 = lVar3 + 2;
      client_random = client_random + 1;
    } while (lVar3 != 0x40);
    auStack_b7[__n] = 0x20;
    lVar3 = __n + 0x40;
    if (secretlen == 0) {
      lVar2 = __n + 0x42;
    }
    else {
      sVar4 = 0;
      do {
        lVar2 = lVar3;
        bVar1 = secret[sVar4];
        acStack_f8[lVar2 + 2] = "0123456789ABCDEF"[bVar1 >> 4];
        acStack_f8[lVar2 + 3] = "0123456789ABCDEF"[bVar1 & 0xf];
        sVar4 = sVar4 + 1;
        lVar3 = lVar2 + 2;
      } while (secretlen != sVar4);
      lVar2 = lVar2 + 4;
    }
    acStack_f8[lVar2] = '\n';
    acStack_f8[lVar3 + 3] = '\0';
    fputs(acStack_f8,(FILE *)__stream);
    return true;
  }
  return false;
}

Assistant:

bool
Curl_tls_keylog_write(const char *label,
                      const unsigned char client_random[CLIENT_RANDOM_SIZE],
                      const unsigned char *secret, size_t secretlen)
{
  const char *hex = "0123456789ABCDEF";
  size_t pos, i;
  char line[KEYLOG_LABEL_MAXLEN + 1 + 2 * CLIENT_RANDOM_SIZE + 1 +
            2 * SECRET_MAXLEN + 1 + 1];

  if(!keylog_file_fp) {
    return false;
  }

  pos = strlen(label);
  if(pos > KEYLOG_LABEL_MAXLEN || !secretlen || secretlen > SECRET_MAXLEN) {
    /* Should never happen - sanity check anyway. */
    return false;
  }

  memcpy(line, label, pos);
  line[pos++] = ' ';

  /* Client Random */
  for(i = 0; i < CLIENT_RANDOM_SIZE; i++) {
    line[pos++] = hex[client_random[i] >> 4];
    line[pos++] = hex[client_random[i] & 0xF];
  }
  line[pos++] = ' ';

  /* Secret */
  for(i = 0; i < secretlen; i++) {
    line[pos++] = hex[secret[i] >> 4];
    line[pos++] = hex[secret[i] & 0xF];
  }
  line[pos++] = '\n';
  line[pos] = '\0';

  /* Using fputs here instead of fprintf since libcurl's fprintf replacement
     may not be thread-safe. */
  fputs(line, keylog_file_fp);
  return true;
}